

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# er.cpp
# Opt level: O3

void print_usage_and_exit(int exit_code)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,"er ");
  poVar1 = std::operator<<(poVar1,"[options] n filename");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Options:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  --density                    the average density");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "  --random-edge-filtration     generates random filtration values in [0,1] for all edges"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "  --undirected                 create a graph such that the directed and"
                          );
  poVar1 = std::operator<<(poVar1," undirected flag complexes coincide");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  --help                       print this screen");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(exit_code);
}

Assistant:

void print_usage_and_exit(int exit_code) {
	std::cerr << "Usage: "
	          << "er "
	          << "[options] n filename" << std::endl
	          << std::endl
	          << "Options:" << std::endl
	          << std::endl
	          << "  --density                    the average density" << std::endl
	          << "  --random-edge-filtration     generates random filtration "
	             "values in [0,1] for all edges"
	          << std::endl
	          << "  --undirected                 create a graph such that the directed and"
	          << " undirected flag complexes coincide" << std::endl
	          << "  --help                       print this screen" << std::endl
	          << std::endl;

	exit(exit_code);
}